

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

ROOM_INDEX_DATA * get_room_index(int vnum)

{
  int in_EDI;
  ROOM_INDEX_DATA *pRoomIndex;
  undefined4 in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  ROOM_INDEX_DATA *pRVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  for (pRVar1 = room_index_hash[in_EDI % 0x400]; pRVar1 != (ROOM_INDEX_DATA *)0x0;
      pRVar1 = pRVar1->next) {
    if (pRVar1->vnum == in_EDI) {
      return pRVar1;
    }
  }
  if (!fBootDb) {
    return (ROOM_INDEX_DATA *)0x0;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_EDI,in_stack_fffffffffffffff0),(char *)0x0);
  CLogger::Error<int&>
            ((CLogger *)CONCAT44(vnum,in_stack_00000018),(string_view)in_stack_00000020,
             (int *)pRoomIndex);
  exit(1);
}

Assistant:

ROOM_INDEX_DATA *get_room_index(int vnum)
{
	ROOM_INDEX_DATA *pRoomIndex;

	for (pRoomIndex = room_index_hash[vnum % MAX_KEY_HASH]; pRoomIndex != nullptr; pRoomIndex = pRoomIndex->next)
	{
		if (pRoomIndex->vnum == vnum)
			return pRoomIndex;
	}

	if (fBootDb)
	{
		RS.Logger.Error("Get_room_index: bad vnum %d.", vnum);
		exit(1);
	}

	return nullptr;
}